

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void __thiscall hgdb::json::SymbolTable::remove_module_top(SymbolTable *this,string *name)

{
  bool bVar1;
  _Self local_28;
  _Self local_20;
  string *local_18;
  string *name_local;
  SymbolTable *this_local;
  
  local_18 = name;
  name_local = &this->framework_name_;
  local_20._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(&this->top_names_,name);
  local_28._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->top_names_);
  bVar1 = std::operator!=(&local_20,&local_28);
  if (bVar1) {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&this->top_names_,local_18);
  }
  return;
}

Assistant:

void remove_module_top(const std::string &name) {
        if (top_names_.find(name) != top_names_.end()) {
            top_names_.erase(name);
        }
    }